

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O0

char * Fverb::parameter_symbol(uint index)

{
  char *pcStack_10;
  uint index_local;
  
  switch(index) {
  case 0:
    pcStack_10 = "predelay";
    break;
  case 1:
    pcStack_10 = "input";
    break;
  case 2:
    pcStack_10 = "input_lowpass";
    break;
  case 3:
    pcStack_10 = "input_highpass";
    break;
  case 4:
    pcStack_10 = "input_diffusion_1";
    break;
  case 5:
    pcStack_10 = "input_diffusion_2";
    break;
  case 6:
    pcStack_10 = "tail_density";
    break;
  case 7:
    pcStack_10 = "decay";
    break;
  case 8:
    pcStack_10 = "damping";
    break;
  case 9:
    pcStack_10 = "mod_frequency";
    break;
  case 10:
    pcStack_10 = "mod_depth";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char *Fverb::parameter_symbol(unsigned index) noexcept
{
    switch (index) {

    case 0:
        return "predelay";

    case 1:
        return "input";

    case 2:
        return "input_lowpass";

    case 3:
        return "input_highpass";

    case 4:
        return "input_diffusion_1";

    case 5:
        return "input_diffusion_2";

    case 6:
        return "tail_density";

    case 7:
        return "decay";

    case 8:
        return "damping";

    case 9:
        return "mod_frequency";

    case 10:
        return "mod_depth";

    default:
        return 0;
    }
}